

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_0::getLevelCount(ImageInfo *info)

{
  deUint32 dVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  IVec3 size;
  
  dVar1 = info->m_target;
  tcu::Vector<int,_3>::Vector(&size,&info->m_size);
  if (dVar1 == 0x8d41) {
    iVar3 = 1;
  }
  else {
    uVar2 = size.m_data[1];
    if ((dVar1 != 0x8c1a) && (uVar2 = size.m_data[2], size.m_data[2] < size.m_data[1])) {
      uVar2 = size.m_data[1];
    }
    if ((int)uVar2 < size.m_data[0]) {
      uVar2 = size.m_data[0];
    }
    if (uVar2 == 0) {
      uVar4 = 0x20;
    }
    else {
      uVar4 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    iVar3 = 0x1f - ((uVar4 - 1) + (uint)((uVar2 - 1 & uVar2) == 0));
  }
  return iVar3;
}

Assistant:

deUint32		getTarget		(void) const { return m_target; }